

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool __thiscall Memory::RecyclerParallelThread::StartConcurrent(RecyclerParallelThread *this)

{
  ThreadService *pTVar1;
  code *pcVar2;
  bool bVar3;
  HANDLE pVVar4;
  undefined4 *puVar5;
  
  if (this->recycler->threadService->threadService == (ThreadServiceCallback)0x0) {
    if (this->concurrentWorkDoneEvent == (HANDLE)0x0) {
      bVar3 = EnableConcurrent(this,false);
      return bVar3;
    }
    if (this->concurrentThread == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1acb,"(this->concurrentThread != 0)","this->concurrentThread != NULL");
      if (!bVar3) goto LAB_0070ed5a;
      *puVar5 = 0;
    }
    pVVar4 = this->concurrentWorkReadyEvent;
    if (pVVar4 == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1acc,"(this->concurrentWorkReadyEvent != 0)",
                         "this->concurrentWorkReadyEvent != NULL");
      if (!bVar3) goto LAB_0070ed5a;
      *puVar5 = 0;
      pVVar4 = this->concurrentWorkReadyEvent;
    }
    SetEvent(pVVar4);
  }
  else {
    if (this->concurrentWorkDoneEvent == (HANDLE)0x0) {
      pVVar4 = CreateEventW((LPSECURITY_ATTRIBUTES)0x0,0,0,(LPCWSTR)0x0);
      this->concurrentWorkDoneEvent = pVVar4;
      if (pVVar4 == (HANDLE)0x0) {
        return false;
      }
    }
    if (this->concurrentThread != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1ab9,"(concurrentThread == 0)","concurrentThread == NULL");
      if (!bVar3) goto LAB_0070ed5a;
      *puVar5 = 0;
    }
    if (this->concurrentWorkReadyEvent != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1aba,"(concurrentWorkReadyEvent == 0)",
                         "concurrentWorkReadyEvent == NULL");
      if (!bVar3) {
LAB_0070ed5a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pTVar1 = this->recycler->threadService;
    pTVar1->isInCallback = true;
    bVar3 = (*pTVar1->threadService)(StaticBackgroundWorkCallback,this);
    pTVar1->isInCallback = false;
    if (!bVar3) {
      return false;
    }
  }
  return true;
}

Assistant:

bool
RecyclerParallelThread::StartConcurrent()
{
    if (this->recycler->threadService->HasCallback())
    {
        // This may be the first time.  If so, initialize by creating the doneEvent.
        if (this->concurrentWorkDoneEvent == NULL)
        {
            this->concurrentWorkDoneEvent = CreateEvent(NULL, FALSE, FALSE, NULL);
            if (this->concurrentWorkDoneEvent == nullptr)
            {
                return false;
            }
        }

        Assert(concurrentThread == NULL);
        Assert(concurrentWorkReadyEvent == NULL);

        // Invoke thread service to process work
        if (!this->recycler->threadService->Invoke(RecyclerParallelThread::StaticBackgroundWorkCallback, this))
        {
            return false;
        }
    }
    else
    {
        // This may be the first time.  If so, initialize and create thread.
        if (this->concurrentWorkDoneEvent == NULL)
        {
            return this->EnableConcurrent(false);
        }
        else
        {
            Assert(this->concurrentThread != NULL);
            Assert(this->concurrentWorkReadyEvent != NULL);

            // signal that thread has been initialized
            SetEvent(this->concurrentWorkReadyEvent);
        }
    }
    return true;
}